

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

matches * tabdesc(disctx *ctx,match m,atom *atoms)

{
  int iVar1;
  int iVar2;
  matches *pmVar3;
  matches *__ptr;
  matches *b;
  match *pmVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  match *pmVar8;
  undefined8 *puVar9;
  match *pmVar10;
  byte bVar11;
  match in_stack_ffffffffffffff08;
  
  bVar11 = 0;
  if (atoms->fun == (afun)0x0) {
    __ptr = emptymatches();
    iVar1 = __ptr->mnum;
    iVar2 = __ptr->mmax;
    pmVar4 = __ptr->m;
    if (iVar2 <= iVar1) {
      iVar5 = 0x10;
      if (iVar2 != 0) {
        iVar5 = iVar2 * 2;
      }
      __ptr->mmax = iVar5;
      pmVar4 = (match *)realloc(pmVar4,(long)iVar5 * 0xb8);
      __ptr->m = pmVar4;
    }
    __ptr->mnum = iVar1 + 1;
    memcpy(pmVar4 + iVar1,&m,0xb8);
  }
  else {
    pmVar3 = (*atoms->fun)(ctx,(ull *)0x0,(ull *)0x0,atoms->arg,m.lpos);
    __ptr = (matches *)0x0;
    if (pmVar3 != (matches *)0x0) {
      pmVar4 = &m;
      puVar9 = (undefined8 *)&stack0xffffffffffffff08;
      for (lVar6 = 0x17; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar9 = *(undefined8 *)pmVar4;
        pmVar4 = (match *)((long)pmVar4 + (ulong)bVar11 * -0x10 + 8);
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
      }
      __ptr = mergematches(in_stack_ffffffffffffff08,pmVar3);
      if (atoms[1].fun != (afun)0x0) {
        pmVar3 = emptymatches();
        iVar1 = __ptr->mnum;
        pmVar4 = __ptr->m;
        pmVar10 = pmVar4;
        for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
          pmVar8 = pmVar10;
          puVar9 = (undefined8 *)&stack0xffffffffffffff08;
          for (lVar7 = 0x17; lVar7 != 0; lVar7 = lVar7 + -1) {
            *puVar9 = *(undefined8 *)pmVar8;
            pmVar8 = (match *)((long)pmVar8 + ((ulong)bVar11 * -2 + 1) * 8);
            puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
          }
          b = tabdesc(ctx,in_stack_ffffffffffffff08,atoms + 1);
          if (b != (matches *)0x0) {
            catmatches(pmVar3,b);
          }
          pmVar10 = pmVar10 + 1;
        }
        free(pmVar4);
        free(__ptr);
        __ptr = pmVar3;
      }
    }
  }
  return __ptr;
}

Assistant:

struct matches *tabdesc (struct disctx *ctx, struct match m, const struct atom *atoms) {
	if (!atoms->fun) {
		struct matches *res = emptymatches();
		ADDARRAY(res->m, m);
		return res;
	}
	struct matches *ms = atoms->fun(ctx, 0, 0, atoms->arg, m.lpos);
	if (!ms)
		return 0;
	ms = mergematches(m, ms);
	atoms++;
	if (!atoms->fun)
		return ms;
	struct matches *res = emptymatches();
	int i;
	for (i = 0; i < ms->mnum; i++) {
		struct matches *tmp = tabdesc(ctx, ms->m[i], atoms);
		if (tmp)
			res = catmatches(res, tmp);
	}
	free(ms->m);
	free(ms);
	return res;
}